

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionParseException::OptionParseException(OptionParseException *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  OptionException::OptionException(&this->super_OptionException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_OptionException = &PTR__OptionException_00177498;
  return;
}

Assistant:

explicit OptionParseException(const std::string& message)
    : OptionException(message)
    {
    }